

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushOverrideID(ImGuiID id)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  uint *__src;
  uint *__dest;
  int iVar3;
  int iVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  if (GImGui->DebugHookIdInfo == id) {
    DebugHookIdInfo(id,0xe,(void *)0x0,(void *)0x0);
  }
  iVar4 = (pIVar2->IDStack).Size;
  iVar1 = (pIVar2->IDStack).Capacity;
  if (iVar4 == iVar1) {
    iVar4 = iVar4 + 1;
    if (iVar1 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar1 / 2 + iVar1;
    }
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    if (iVar1 < iVar4) {
      __dest = (uint *)MemAlloc((long)iVar4 << 2);
      __src = (pIVar2->IDStack).Data;
      if (__src != (uint *)0x0) {
        memcpy(__dest,__src,(long)(pIVar2->IDStack).Size << 2);
        MemFree((pIVar2->IDStack).Data);
      }
      (pIVar2->IDStack).Data = __dest;
      (pIVar2->IDStack).Capacity = iVar4;
    }
  }
  (pIVar2->IDStack).Data[(pIVar2->IDStack).Size] = id;
  (pIVar2->IDStack).Size = (pIVar2->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_ID, NULL, NULL);
#endif
    window->IDStack.push_back(id);
}